

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef Catch::trim(StringRef ref)

{
  byte bVar1;
  char *pcVar2;
  ulong index;
  ulong in_RSI;
  ulong uVar3;
  char *in_RDI;
  ulong uVar4;
  size_type index_00;
  StringRef SVar5;
  StringRef local_38;
  
  index = 0;
  local_38.m_start = in_RDI;
  local_38.m_size = in_RSI;
  while (((index < local_38.m_size && (bVar1 = StringRef::operator[](&local_38,index), bVar1 < 0x21)
          ) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0))) {
    index = index + 1;
  }
  uVar4 = local_38.m_size - index;
  index_00 = local_38.m_size;
  while (index < index_00) {
    index_00 = index_00 - 1;
    bVar1 = StringRef::operator[](&local_38,index_00);
    if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    uVar4 = uVar4 - 1;
  }
  uVar3 = local_38.m_size - index;
  pcVar2 = "";
  if (index <= local_38.m_size && uVar3 != 0) {
    pcVar2 = local_38.m_start + index;
  }
  if (uVar4 <= uVar3) {
    uVar3 = uVar4;
  }
  uVar4 = 0;
  if (index < local_38.m_size) {
    uVar4 = uVar3;
  }
  SVar5.m_size = uVar4;
  SVar5.m_start = pcVar2;
  return SVar5;
}

Assistant:

StringRef trim(StringRef ref) {
    const auto is_ws = [](char c) { return c == ' ' || c == '\t' || c == '\n' || c == '\r'; };
    size_t real_begin = 0;
    while (real_begin < ref.size() && is_ws(ref[real_begin])) {
      ++real_begin;
    }
    size_t real_end = ref.size();
    while (real_end > real_begin && is_ws(ref[real_end - 1])) {
      --real_end;
    }

    return ref.substr(real_begin, real_end - real_begin);
  }